

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZContBufferedStream.cpp
# Opt level: O2

TPZContBufferedStream * __thiscall
TPZContBufferedStream::operator<<(TPZContBufferedStream *this,TPZContBufferedStream *other)

{
  void *pvVar1;
  ulong uVar2;
  ulong local_30;
  
  uVar2 = (ulong)(uint)other->fSize;
  pvVar1 = operator_new__(uVar2);
  local_30 = uVar2;
  (*(other->super_TPZStream)._vptr_TPZStream[0x39])(other,pvVar1,&local_30);
  local_30 = uVar2;
  (*(this->super_TPZStream)._vptr_TPZStream[0x3a])(this,pvVar1,&local_30);
  operator_delete__(pvVar1);
  return this;
}

Assistant:

TPZContBufferedStream &TPZContBufferedStream::
operator<<(const TPZContBufferedStream &other) {
    const unsigned int nBytesOther = other.fSize;
    char *temp = new char[nBytesOther];
    other.ConstRead(temp, nBytesOther);
    WriteToBuffer(temp, nBytesOther);
    delete[] temp;
    return *this;
}